

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::BufferToBufferInvertTest::initPrograms
          (BufferToBufferInvertTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *this_00;
  char *pcVar2;
  ostringstream src;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [40];
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  if (this->m_bufferType == BUFFER_TYPE_SSBO) {
    poVar1 = std::operator<<((ostream *)local_188,"#version 310 es\n");
    poVar1 = std::operator<<(poVar1,"layout (local_size_x = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[0]);
    poVar1 = std::operator<<(poVar1,", local_size_y = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
    poVar1 = std::operator<<(poVar1,", local_size_z = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[2]);
    poVar1 = std::operator<<(poVar1,") in;\n");
    poVar1 = std::operator<<(poVar1,"layout(binding = 0, std140) readonly buffer Input {\n");
    poVar1 = std::operator<<(poVar1,"    uint values[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"];\n");
    poVar1 = std::operator<<(poVar1,"} sb_in;\n");
    poVar1 = std::operator<<(poVar1,"layout (binding = 1, std140) writeonly buffer Output {\n");
    poVar1 = std::operator<<(poVar1,"    uint values[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"];\n");
    poVar1 = std::operator<<(poVar1,"} sb_out;\n");
    poVar1 = std::operator<<(poVar1,"void main (void) {\n");
    poVar1 = std::operator<<(poVar1,
                             "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
    poVar1 = std::operator<<(poVar1,
                             "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                            );
    poVar1 = std::operator<<(poVar1,"    uint offset          = numValuesPerInv*groupNdx;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
    pcVar2 = "        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n";
  }
  else {
    if (this->m_bufferType != BUFFER_TYPE_UNIFORM) goto LAB_006a20b5;
    poVar1 = std::operator<<((ostream *)local_188,"#version 310 es\n");
    poVar1 = std::operator<<(poVar1,"layout (local_size_x = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[0]);
    poVar1 = std::operator<<(poVar1,", local_size_y = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
    poVar1 = std::operator<<(poVar1,", local_size_z = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[2]);
    poVar1 = std::operator<<(poVar1,") in;\n");
    poVar1 = std::operator<<(poVar1,"layout(binding = 0) readonly uniform Input {\n");
    poVar1 = std::operator<<(poVar1,"    uint values[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"];\n");
    poVar1 = std::operator<<(poVar1,"} ub_in;\n");
    poVar1 = std::operator<<(poVar1,"layout(binding = 1, std140) writeonly buffer Output {\n");
    poVar1 = std::operator<<(poVar1,"    uint values[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"];\n");
    poVar1 = std::operator<<(poVar1,"} sb_out;\n");
    poVar1 = std::operator<<(poVar1,"void main (void) {\n");
    poVar1 = std::operator<<(poVar1,
                             "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
    poVar1 = std::operator<<(poVar1,
                             "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                            );
    poVar1 = std::operator<<(poVar1,"    uint offset          = numValuesPerInv*groupNdx;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
    pcVar2 = "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"}\n");
LAB_006a20b5:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"comp",&local_1f1);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1d0);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_1b0,&local_1f0);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_1b0);
  std::__cxx11::string::~string((string *)(local_1b0 + 8));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void BufferToBufferInvertTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	if (m_bufferType == BUFFER_TYPE_UNIFORM)
	{
		src << "#version 310 es\n"
			<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
			<< "layout(binding = 0) readonly uniform Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} ub_in;\n"
			<< "layout(binding = 1, std140) writeonly buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n"
			<< "}\n";
	}
	else if (m_bufferType == BUFFER_TYPE_SSBO)
	{
		src << "#version 310 es\n"
			<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
			<< "layout(binding = 0, std140) readonly buffer Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_in;\n"
			<< "layout (binding = 1, std140) writeonly buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n"
			<< "}\n";
	}

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}